

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

pair<Polynom<Rational>,_Polynom<Rational>_> * __thiscall
Polynom<Rational>::ordinalDiv(Polynom<Rational> *this,Polynom<Rational> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  pair<Polynom<Rational>,_Polynom<Rational>_> *in_RDI;
  Polynom<Rational> rem;
  compare_t cmp_1;
  Polynom<Rational> res_1;
  Polynom<Rational> t_1;
  BigInteger mid;
  compare_t cmp;
  Polynom<Rational> res;
  Polynom<Rational> t;
  BigInteger r;
  BigInteger l;
  int coeff;
  Matrix<Rational> m;
  int d;
  Rational *in_stack_fffffffffffffc28;
  Rational *in_stack_fffffffffffffc30;
  row_t in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  compare_t in_stack_fffffffffffffc44;
  BigInteger *in_stack_fffffffffffffc48;
  Rational *in_stack_fffffffffffffc50;
  row_t in_stack_fffffffffffffc58;
  BigInteger *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  byte in_stack_fffffffffffffc77;
  uint in_stack_fffffffffffffc78;
  compare_t in_stack_fffffffffffffc7c;
  Matrix<Rational> *in_stack_fffffffffffffc80;
  Polynom<Rational> *in_stack_fffffffffffffd18;
  row_t in_stack_fffffffffffffd20;
  Polynom<Rational> *in_stack_fffffffffffffd28;
  MatrixRow<Rational_&> local_260;
  BigInteger local_258 [2];
  BigInteger local_218 [6];
  uint local_154;
  compare_t local_13c;
  MatrixRow<Rational_&> local_118 [11];
  Polynom<Rational> *in_stack_ffffffffffffff40;
  Polynom<Rational> *in_stack_ffffffffffffff48;
  uint local_4c;
  
  bVar1 = isOrdinal(in_stack_fffffffffffffd18);
  if ((!bVar1) || (bVar1 = isOrdinal(in_stack_fffffffffffffd18), !bVar1)) {
    uVar4 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    __cxa_throw(uVar4,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  iVar2 = degree((Polynom<Rational> *)in_stack_fffffffffffffc48);
  if (iVar2 < 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    matrix_error::runtime_error
              ((matrix_error *)in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
    __cxa_throw(uVar4,&matrix_error::typeinfo,matrix_error::~matrix_error);
  }
  iVar2 = degree((Polynom<Rational> *)in_stack_fffffffffffffc48);
  if ((iVar2 < 0) || (iVar3 = degree((Polynom<Rational> *)in_stack_fffffffffffffc48), iVar2 < iVar3)
     ) {
    Polynom((Polynom<Rational> *)0x178539);
    std::pair<Polynom<Rational>,_Polynom<Rational>_>::pair<Polynom<Rational>,_true>
              ((pair<Polynom<Rational>,_Polynom<Rational>_> *)in_stack_fffffffffffffc50,
               (Polynom<Rational> *)in_stack_fffffffffffffc48,
               (Polynom<Rational> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    ~Polynom((Polynom<Rational> *)0x178565);
  }
  else {
    Matrix<Rational>::Matrix
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78);
    for (local_4c = 0; (int)local_4c < iVar2 + 1; local_4c = local_4c + 1) {
      BigInteger::BigInteger
                ((BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 (longlong)in_stack_fffffffffffffc38.arr);
      BigInteger::BigInteger
                ((BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 (longlong)in_stack_fffffffffffffc38.arr);
      while( true ) {
        BigInteger::BigInteger
                  ((BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (longlong)in_stack_fffffffffffffc38.arr);
        ::operator-(in_stack_fffffffffffffc48,
                    (BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
        Rational::Rational(in_stack_fffffffffffffc30,&in_stack_fffffffffffffc28->_numerator);
        local_118[0].arr = (Rational *)Matrix<Rational>::operator[](in_stack_fffffffffffffc28,0);
        Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_118,local_4c);
        Rational::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        Rational::~Rational(in_stack_fffffffffffffc30);
        BigInteger::~BigInteger((BigInteger *)0x1786a9);
        BigInteger::~BigInteger((BigInteger *)0x1786b6);
        Polynom((Polynom<Rational> *)in_stack_fffffffffffffc50,
                (Matrix<Rational> *)in_stack_fffffffffffffc48);
        ordinalMul(in_stack_fffffffffffffd28,(Polynom<Rational> *)in_stack_fffffffffffffd20.arr);
        in_stack_fffffffffffffc7c =
             ordinalCmp((Polynom<Rational> *)
                        CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                        (Polynom<Rational> *)
                        CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
        local_13c = in_stack_fffffffffffffc7c;
        if (in_stack_fffffffffffffc7c == CMP_EQUAL) {
          Polynom((Polynom<Rational> *)0x17872d);
          std::pair<Polynom<Rational>,_Polynom<Rational>_>::
          pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
                    ((pair<Polynom<Rational>,_Polynom<Rational>_> *)in_stack_fffffffffffffc50,
                     (Polynom<Rational> *)in_stack_fffffffffffffc48,
                     (Polynom<Rational> *)
                     CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
          ~Polynom((Polynom<Rational> *)0x17875b);
          local_154 = 1;
        }
        else if (in_stack_fffffffffffffc7c == CMP_LESS) {
          local_154 = 5;
        }
        else {
          local_154 = 0;
        }
        ~Polynom((Polynom<Rational> *)0x178861);
        ~Polynom((Polynom<Rational> *)0x17886e);
        in_stack_fffffffffffffc78 = local_154;
        if (local_154 != 0) break;
        BigInteger::BigInteger
                  ((BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (longlong)in_stack_fffffffffffffc38.arr);
        BigInteger::operator*=
                  ((BigInteger *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc68);
        BigInteger::~BigInteger((BigInteger *)0x1788c3);
      }
      if (local_154 == 5) {
        do {
          BigInteger::BigInteger
                    ((BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (longlong)in_stack_fffffffffffffc38.arr);
          ::operator+(in_stack_fffffffffffffc48,
                      (BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
          in_stack_fffffffffffffc77 =
               operator<(&in_stack_fffffffffffffc30->_numerator,
                         &in_stack_fffffffffffffc28->_numerator);
          BigInteger::~BigInteger((BigInteger *)0x17893e);
          BigInteger::~BigInteger((BigInteger *)0x17894b);
          if ((in_stack_fffffffffffffc77 & 1) == 0) {
            Rational::Rational(in_stack_fffffffffffffc30,&in_stack_fffffffffffffc28->_numerator);
            in_stack_fffffffffffffc38 = Matrix<Rational>::operator[](in_stack_fffffffffffffc28,0);
            in_stack_fffffffffffffd20 = in_stack_fffffffffffffc38;
            in_stack_fffffffffffffc30 =
                 Matrix<Rational>::MatrixRow<Rational_&>::operator[]
                           ((MatrixRow<Rational_&> *)&stack0xfffffffffffffd20,local_4c);
            Rational::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
            Rational::~Rational(in_stack_fffffffffffffc30);
            local_154 = 0;
            break;
          }
          ::operator+(in_stack_fffffffffffffc48,
                      (BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
          in_stack_fffffffffffffc68 = local_218;
          BigInteger::BigInteger
                    ((BigInteger *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (longlong)in_stack_fffffffffffffc38.arr);
          ::operator/(&(in_stack_fffffffffffffc58.arr)->_numerator,
                      &in_stack_fffffffffffffc50->_numerator);
          BigInteger::~BigInteger((BigInteger *)0x1789b7);
          BigInteger::~BigInteger((BigInteger *)0x1789c4);
          Rational::Rational(in_stack_fffffffffffffc30,&in_stack_fffffffffffffc28->_numerator);
          in_stack_fffffffffffffc58 = Matrix<Rational>::operator[](in_stack_fffffffffffffc28,0);
          local_260.arr = in_stack_fffffffffffffc58.arr;
          in_stack_fffffffffffffc50 =
               Matrix<Rational>::MatrixRow<Rational_&>::operator[](&local_260,local_4c);
          in_stack_fffffffffffffc48 = local_258;
          Rational::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          Rational::~Rational(in_stack_fffffffffffffc30);
          Polynom((Polynom<Rational> *)in_stack_fffffffffffffc50,
                  (Matrix<Rational> *)in_stack_fffffffffffffc48);
          ordinalMul(in_stack_fffffffffffffd28,(Polynom<Rational> *)in_stack_fffffffffffffd20.arr);
          in_stack_fffffffffffffc44 =
               ordinalCmp((Polynom<Rational> *)
                          CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                          (Polynom<Rational> *)
                          CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
          if (in_stack_fffffffffffffc44 == CMP_EQUAL) {
            Polynom((Polynom<Rational> *)0x178ab1);
            std::pair<Polynom<Rational>,_Polynom<Rational>_>::
            pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
                      ((pair<Polynom<Rational>,_Polynom<Rational>_> *)in_stack_fffffffffffffc50,
                       (Polynom<Rational> *)in_stack_fffffffffffffc48,
                       (Polynom<Rational> *)
                       CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
            ~Polynom((Polynom<Rational> *)0x178adf);
            local_154 = 1;
          }
          else {
            if (in_stack_fffffffffffffc44 == CMP_LESS) {
              BigInteger::operator=
                        (&in_stack_fffffffffffffc30->_numerator,
                         &in_stack_fffffffffffffc28->_numerator);
            }
            else {
              BigInteger::operator=
                        (&in_stack_fffffffffffffc30->_numerator,
                         &in_stack_fffffffffffffc28->_numerator);
            }
            local_154 = 0;
          }
          ~Polynom((Polynom<Rational> *)0x178c0d);
          ~Polynom((Polynom<Rational> *)0x178c1a);
          BigInteger::~BigInteger((BigInteger *)0x178c27);
        } while (local_154 == 0);
      }
      BigInteger::~BigInteger((BigInteger *)0x178cf5);
      BigInteger::~BigInteger((BigInteger *)0x178d02);
      if (local_154 != 0) goto LAB_00178ee7;
    }
    Polynom((Polynom<Rational> *)in_stack_fffffffffffffc50,
            (Matrix<Rational> *)in_stack_fffffffffffffc48);
    ordinalMul(in_stack_fffffffffffffd28,(Polynom<Rational> *)in_stack_fffffffffffffd20.arr);
    ordinalSub(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    ~Polynom((Polynom<Rational> *)0x178dd5);
    ~Polynom((Polynom<Rational> *)0x178de2);
    Polynom((Polynom<Rational> *)in_stack_fffffffffffffc50,
            (Matrix<Rational> *)in_stack_fffffffffffffc48);
    std::pair<Polynom<Rational>,_Polynom<Rational>_>::
    pair<Polynom<Rational>,_Polynom<Rational>_&,_true>
              ((pair<Polynom<Rational>,_Polynom<Rational>_> *)in_stack_fffffffffffffc50,
               (Polynom<Rational> *)in_stack_fffffffffffffc48,
               (Polynom<Rational> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    ~Polynom((Polynom<Rational> *)0x178e25);
    local_154 = 1;
    ~Polynom((Polynom<Rational> *)0x178e3d);
LAB_00178ee7:
    Matrix<Rational>::~Matrix
              ((Matrix<Rational> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  }
  return in_RDI;
}

Assistant:

const std::pair<Polynom<Field>, Polynom<Field>> Polynom<Field>::ordinalDiv(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        throw matrix_error("Ordinal division by zero");
    int d = degree();
    if(d < 0 || d < a.degree())
        return {Polynom(), *this};
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    Polynom rem = ordinalSub(a.ordinalMul(Polynom(m)));
    return {Polynom(m), rem};
}